

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,Allocator *_allocator)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  bool bVar1;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Allocator *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  Mat *in_stack_fffffffffffffed0;
  int local_dc;
  
  if (*(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
      (int)in_RSI[7] == in_EDX * in_ECX) {
    if (((int)in_RSI[5] < 3) ||
       (in_RSI[8] ==
        (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
        (long)*(int *)((long)in_RSI + 0x34))) {
      in_RDI->data = (void *)*in_RSI;
      in_RDI->refcount = (int *)in_RSI[1];
      in_RDI->elemsize = in_RSI[2];
      in_RDI->elempack = (int)in_RSI[3];
      in_RDI->allocator = (Allocator *)in_RSI[4];
      in_RDI->dims = (int)in_RSI[5];
      in_RDI->w = *(int *)((long)in_RSI + 0x2c);
      in_RDI->h = (int)in_RSI[6];
      in_RDI->d = *(int *)((long)in_RSI + 0x34);
      in_RDI->c = (int)in_RSI[7];
      in_RDI->cstep = in_RSI[8];
      if (in_RDI->refcount != (int *)0x0) {
        LOCK();
        *in_RDI->refcount = *in_RDI->refcount + 1;
        UNLOCK();
      }
      in_RDI->dims = 2;
      in_RDI->w = in_EDX;
      in_RDI->h = in_ECX;
      in_RDI->d = 1;
      in_RDI->c = 1;
      in_RDI->cstep = (long)in_EDX * (long)in_ECX;
    }
    else {
      in_RDI->data = (void *)0x0;
      in_RDI->refcount = (int *)0x0;
      in_RDI->elemsize = 0;
      in_RDI->elempack = 0;
      in_RDI->allocator = (Allocator *)0x0;
      in_RDI->dims = 0;
      in_RDI->w = 0;
      in_RDI->h = 0;
      in_RDI->d = 0;
      in_RDI->c = 0;
      in_RDI->cstep = 0;
      create(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
             in_stack_fffffffffffffeb0);
      bVar1 = true;
      if (in_RDI->data != (void *)0x0) {
        bVar1 = in_RDI->cstep * (long)in_RDI->c == 0;
      }
      if (!bVar1) {
        for (local_dc = 0; local_dc < (int)in_RSI[7]; local_dc = local_dc + 1) {
          memcpy((void *)((long)in_RDI->data +
                         (long)local_dc * (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6]
                         * (long)*(int *)((long)in_RSI + 0x34) * in_RSI[2]),
                 (void *)(*in_RSI + (long)local_dc * in_RSI[8] * in_RSI[2]),
                 (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
                 (long)*(int *)((long)in_RSI + 0x34) * in_RSI[2]);
        }
      }
    }
  }
  else {
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::reshape(int _w, int _h, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h)
        return Mat();

    if (dims >= 3 && cstep != (size_t)w * h * d)
    {
        Mat m;
        m.create(_w, _h, elemsize, elempack, _allocator);
        if (m.empty())
            return m;

        // flatten
        for (int i = 0; i < c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + (size_t)i * w * h * d * elemsize;
            memcpy(mptr, ptr, (size_t)w * h * d * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 2;
    m.w = _w;
    m.h = _h;
    m.d = 1;
    m.c = 1;

    m.cstep = (size_t)_w * _h;

    return m;
}